

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::Printer::HardenedPrintString
               (string_view src,BaseTextGenerator *generator)

{
  pointer pcVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  _func_int **in_RCX;
  pointer pcVar5;
  pointer pcVar6;
  _Alloc_hider _Var7;
  pointer __pos;
  _func_int **pp_Var8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view src_00;
  string_view src_local;
  string local_50;
  
  pp_Var8 = (_func_int **)src._M_str;
  _Var7._M_p = (pointer)src._M_len;
  src_local._M_len = (size_t)_Var7._M_p;
  src_local._M_str = (char *)pp_Var8;
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  while (_Var7._M_p != (pointer)0x0) {
    local_50._M_dataplus._M_p = _Var7._M_p;
    local_50._M_string_length = (size_type)pp_Var8;
    for (__pos = (pointer)0x0; pcVar5 = _Var7._M_p, __pos < _Var7._M_p; __pos = __pos + 1) {
      bVar3 = *(byte *)(local_50._M_string_length + (long)__pos);
      pcVar5 = __pos;
      if ((char)bVar3 < '\0') {
        do {
          pcVar1 = pcVar5 + 1;
          pcVar6 = _Var7._M_p;
          if (_Var7._M_p <= pcVar1) break;
          pcVar2 = pcVar5 + local_50._M_string_length + 1;
          pcVar5 = pcVar1;
          pcVar6 = pcVar1;
        } while (*pcVar2 < '\0');
        in_RCX = (_func_int **)local_50._M_string_length;
        bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,
                           (size_type)__pos,(long)pcVar6 - (long)__pos);
        sVar4 = utf8_range_ValidPrefix(bVar9._M_str,bVar9._M_len);
        if (sVar4 != (long)pcVar6 - (long)__pos) {
          pcVar5 = __pos + sVar4;
          break;
        }
        __pos = pcVar6 + -1;
        _Var7._M_p = local_50._M_dataplus._M_p;
      }
      else {
        in_RCX = (_func_int **)(ulong)(bVar3 - 0x20);
        if ((0x5e < (byte)(bVar3 - 0x20)) ||
           ((bVar3 - 0x22 < 0x3b &&
            ((0x400000000000021U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) != 0)))) break;
      }
    }
    if (pcVar5 != (pointer)0x0) {
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&src_local,0,(size_type)pcVar5);
      in_RCX = generator->_vptr_BaseTextGenerator;
      (*in_RCX[5])(generator,bVar9._M_str,bVar9._M_len);
      src_local._M_str = src_local._M_str + (long)pcVar5;
      src_local._M_len = src_local._M_len - (long)pcVar5;
      if (src_local._M_len == 0) break;
    }
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&src_local,0,1);
    src_00._M_len = bVar9._M_str;
    src_00._M_str = (char *)in_RCX;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)bVar9._M_len,src_00);
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    pp_Var8 = (_func_int **)(src_local._M_str + 1);
    _Var7._M_p = (pointer)(src_local._M_len - 1);
    src_local._M_len = (size_t)_Var7._M_p;
    src_local._M_str = (char *)pp_Var8;
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}